

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

sexp_conflict
sexp_get_opcode_param_type
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict op,sexp_conflict k)

{
  byte bVar1;
  uint uVar2;
  sexp_conflict psVar3;
  sexp *ppsVar4;
  uint uVar5;
  sexp_conflict psStack_58;
  sexp_conflict psStack_50;
  sexp_gc_var_t sStack_48;
  sexp_gc_var_t sStack_38;
  
  if ((((ulong)op & 3) != 0) || (op->tag != 0x1b)) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0x1b);
    return psVar3;
  }
  if (((ulong)k & 1) == 0) {
    psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2,k);
    return psVar3;
  }
  bVar1 = (op->value).opcode.num_args;
  uVar2 = (uint)((long)k >> 1);
  uVar5 = uVar2;
  if (((int)(uint)bVar1 < (int)uVar2) && (uVar5 = (uint)bVar1, ((op->value).opcode.flags & 1) == 0))
  {
    uVar5 = uVar2;
  }
  if (uVar5 == 1) {
    ppsVar4 = &(op->value).type.print;
  }
  else if (uVar5 == 0) {
    ppsVar4 = &(op->value).type.id;
  }
  else {
    psStack_58 = (op->value).type.dl;
    if (psStack_58 == (sexp_conflict)0x0) {
      psVar3 = sexp_translate_opcode_type(ctx,(sexp_conflict)0x0);
      return psVar3;
    }
    if ((((ulong)psStack_58 & 3) != 0) || (psStack_58->tag != 10)) {
      sStack_38.var = &psStack_58;
      psStack_50 = (sexp_conflict)0x43e;
      if (psStack_58 == (sexp_conflict)0x0) {
        psStack_58 = (sexp_conflict)((((ctx->value).type.setters)->value).port.stream)->_IO_read_end
        ;
      }
      if (((ulong)psStack_58 & 1) == 0) {
        if (psStack_58 == (sexp_conflict)0x23e) {
          sStack_48.next = &sStack_38;
          sStack_38.next = (ctx->value).context.saves;
          sStack_48.var = &psStack_50;
          (ctx->value).context.saves = &sStack_48;
          psStack_50 = (sexp_conflict)sexp_intern(ctx,"or",0xffffffffffffffff);
          psStack_58 = (sexp_conflict)sexp_cons_op(ctx,0,2,0x23e,0x23e);
          psStack_58 = (sexp_conflict)
                       sexp_cons_op(ctx,0,2,((((ctx->value).type.setters)->value).port.stream)->
                                            _IO_buf_end,psStack_58);
          psStack_58 = (sexp_conflict)sexp_cons_op(ctx,0,2,psStack_50,psStack_58);
          (ctx->value).context.saves = sStack_38.next;
        }
      }
      else {
        psStack_58 = *(sexp_conflict *)
                      ((long)&((((ctx->value).type.setters)->value).type.getters)->value +
                      ((ulong)psStack_58 & 0xfffffffffffffffe) * 4 + 8);
      }
      return psStack_58;
    }
    if ((sexp)(ulong)(uVar2 - 2) < (psStack_58->value).type.name) {
      ppsVar4 = (sexp *)((long)&psStack_58->value + ((long)k * 4 - 0x10U & 0xfffffffffffffff8) + 8);
    }
    else {
      ppsVar4 = (sexp *)&((((ctx->value).type.setters)->value).port.stream)->_IO_read_end;
    }
  }
  psVar3 = sexp_translate_opcode_type(ctx,*ppsVar4);
  return psVar3;
}

Assistant:

sexp sexp_get_opcode_param_type (sexp ctx, sexp self, sexp_sint_t n, sexp op, sexp k) {
  sexp res;
  int p = sexp_unbox_fixnum(k);
  if (! sexp_opcodep(op))
    return sexp_type_exception(ctx, self, SEXP_OPCODE, op);
  else if (! sexp_fixnump(k))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, k);
  if (p > sexp_opcode_num_args(op) && sexp_opcode_variadic_p(op))
    p = sexp_opcode_num_args(op);
  switch (p) {
  case 0:
    res = sexp_opcode_arg1_type(op);
    break;
  case 1:
    res = sexp_opcode_arg2_type(op);
    break;
  default:
    res = sexp_opcode_arg3_type(op);
    if (res && sexp_vectorp(res)) {
      if (sexp_vector_length(res) > (unsigned)(sexp_unbox_fixnum(k)-2))
        res = sexp_vector_ref(res, sexp_fx_sub(k, SEXP_TWO));
      else
        res = sexp_type_by_index(ctx, SEXP_OBJECT);
    }
    break;
  }
  return sexp_translate_opcode_type(ctx, res);
}